

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubClient_LL_UploadToBlob_UploadMultipleBlocks
          (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE azureStorageClientHandle,
          IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_CALLBACK_EX getDataCallbackEx,void *context)

{
  int iVar1;
  IOTHUB_CLIENT_RESULT IVar2;
  LOGGER_LOG p_Var3;
  undefined8 in_stack_ffffffffffffff80;
  undefined4 uVar4;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  ulong uStack_48;
  IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_RESULT getDataReturnValue;
  size_t blockDataSize;
  uchar *blockDataPtr;
  _Bool isError;
  LOGGER_LOG p_Stack_30;
  uint blockID;
  LOGGER_LOG l;
  void *pvStack_20;
  IOTHUB_CLIENT_RESULT result;
  void *context_local;
  IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_CALLBACK_EX getDataCallbackEx_local;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE azureStorageClientHandle_local;
  
  pvStack_20 = context;
  context_local = getDataCallbackEx;
  getDataCallbackEx_local = (IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_CALLBACK_EX)azureStorageClientHandle
  ;
  if ((azureStorageClientHandle == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)0x0) ||
     (getDataCallbackEx == (IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_CALLBACK_EX)0x0)) {
    p_Stack_30 = xlogging_get_log_function();
    if (p_Stack_30 != (LOGGER_LOG)0x0) {
      (*p_Stack_30)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                    ,"IoTHubClient_LL_UploadToBlob_UploadMultipleBlocks",0x464,1,
                    "invalid argument detected azureStorageClientHandle=%p getDataCallbackEx=%p",
                    getDataCallbackEx_local,context_local);
    }
    l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
  }
  else {
    blockDataPtr._4_4_ = 0;
    blockDataSize = 0;
    uStack_48 = 0;
    while( true ) {
      iVar1 = (*(code *)context_local)(0,&blockDataSize,&stack0xffffffffffffffb8,pvStack_20);
      uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff80 >> 0x20);
      if (iVar1 == 1) break;
      if ((blockDataSize == 0) || (uStack_48 == 0)) {
        blockDataPtr._3_1_ = '\0';
        goto LAB_0012d8dc;
      }
      if (0x6400000 < uStack_48) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                    ,"IoTHubClient_LL_UploadToBlob_UploadMultipleBlocks",0x484,1,
                    "tried to upload block of size %lu, max allowed size is %d",uStack_48,
                    CONCAT44(uVar4,0x6400000));
        }
        blockDataPtr._3_1_ = '\x01';
        goto LAB_0012d8dc;
      }
      if (49999 < blockDataPtr._4_4_) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                    ,"IoTHubClient_LL_UploadToBlob_UploadMultipleBlocks",0x48a,1,
                    "unable to upload more than %lu blocks in one blob",50000);
        }
        blockDataPtr._3_1_ = '\x01';
        goto LAB_0012d8dc;
      }
      IVar2 = IoTHubClient_LL_UploadToBlob_PutBlock
                        ((IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)getDataCallbackEx_local,
                         blockDataPtr._4_4_,(uint8_t *)blockDataSize,uStack_48);
      if (IVar2 != IOTHUB_CLIENT_OK) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                    ,"IoTHubClient_LL_UploadToBlob_UploadMultipleBlocks",0x490,1,
                    "failed uploading block to blob");
        }
        blockDataPtr._3_1_ = '\x01';
        goto LAB_0012d8dc;
      }
      blockDataPtr._4_4_ = blockDataPtr._4_4_ + 1;
    }
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_INFO,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                ,"IoTHubClient_LL_UploadToBlob_UploadMultipleBlocks",0x475,1,
                "Upload to blob has been aborted by the user");
    }
    blockDataPtr._3_1_ = '\x01';
LAB_0012d8dc:
    if (blockDataPtr._3_1_ == '\0') {
      if ((blockDataPtr._4_4_ == 0) ||
         (IVar2 = IoTHubClient_LL_UploadToBlob_PutBlockList
                            ((IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)getDataCallbackEx_local),
         IVar2 == IOTHUB_CLIENT_OK)) {
        (*(code *)context_local)(0,0,0,pvStack_20);
        l._4_4_ = IOTHUB_CLIENT_OK;
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                    ,"IoTHubClient_LL_UploadToBlob_UploadMultipleBlocks",0x4a5,1,
                    "Failed to perform Azure Blob Put Block List operation");
        }
        (*(code *)context_local)(1,0,0,pvStack_20);
        l._4_4_ = IOTHUB_CLIENT_ERROR;
      }
    }
    else {
      (*(code *)context_local)(1,0,0,pvStack_20);
      l._4_4_ = IOTHUB_CLIENT_ERROR;
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClient_LL_UploadToBlob_UploadMultipleBlocks(IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE azureStorageClientHandle, IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_CALLBACK_EX getDataCallbackEx, void* context)
{
    IOTHUB_CLIENT_RESULT result;

    if (azureStorageClientHandle == NULL || getDataCallbackEx == NULL)
    {
        LogError("invalid argument detected azureStorageClientHandle=%p getDataCallbackEx=%p", azureStorageClientHandle, getDataCallbackEx);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        unsigned int blockID = 0;
        bool isError;
        unsigned char const * blockDataPtr = NULL;
        size_t blockDataSize = 0;
        IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_RESULT getDataReturnValue;

        do
        {
            getDataReturnValue = getDataCallbackEx(FILE_UPLOAD_OK, &blockDataPtr, &blockDataSize, context);

            if (getDataReturnValue == IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_ABORT)
            {
                LogInfo("Upload to blob has been aborted by the user");
                isError = true;
                break;
            }
            else if (blockDataPtr == NULL || blockDataSize == 0)
            {
                // This is how the user indicates that there is no more data to be uploaded,
                // and the function can end with success result.
                isError = false;
                break;
            }
            else
            {
                if (blockDataSize > BLOCK_SIZE)
                {
                    LogError("tried to upload block of size %lu, max allowed size is %d", (unsigned long)blockDataSize, BLOCK_SIZE);
                    isError = true;
                    break;
                }
                else if (blockID >= MAX_BLOCK_COUNT)
                {
                    LogError("unable to upload more than %lu blocks in one blob", (unsigned long)MAX_BLOCK_COUNT);
                    isError = true;
                    break;
                }
                else if (IoTHubClient_LL_UploadToBlob_PutBlock(azureStorageClientHandle, blockID, blockDataPtr, blockDataSize) != IOTHUB_CLIENT_OK)
                {
                    LogError("failed uploading block to blob");
                    isError = true;
                    break;
                }

                blockID++;
            }
        }
        while(true);

        if (isError)
        {
            (void)getDataCallbackEx(FILE_UPLOAD_ERROR, NULL, NULL, context);
            result = IOTHUB_CLIENT_ERROR;
        }
        // Checking if blockID is greater than 0 guarantees that PUT BLOCK LIST will only
        // be attempted if at least one block has indeed been uploaded to Azure Storage.
        // This behavior follows the behavior of the original implementation of
        // Upload-to-Blob in azure-iot-sdk-c.
        else if (blockID > 0 && IoTHubClient_LL_UploadToBlob_PutBlockList(azureStorageClientHandle) != IOTHUB_CLIENT_OK)
        {
            LogError("Failed to perform Azure Blob Put Block List operation");
            (void)getDataCallbackEx(FILE_UPLOAD_ERROR, NULL, NULL, context);
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            (void)getDataCallbackEx(FILE_UPLOAD_OK, NULL, NULL, context);
            result = IOTHUB_CLIENT_OK;
        }
    }

    return result;
}